

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
NameResolverTest_NestInFileClassEnumEdition2024_Test::
~NameResolverTest_NestInFileClassEnumEdition2024_Test
          (NameResolverTest_NestInFileClassEnumEdition2024_Test *this)

{
  (this->super_NameResolverTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NameResolverTest_018d7a98;
  DescriptorPool::~DescriptorPool(&(this->super_NameResolverTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(NameResolverTest, NestInFileClassEnumEdition2024) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2024";
      import "third_party/java/protobuf/java_features.proto";
      package proto2_unittest;
      enum NestedInFileClassEnum {
        option features.(pb.java).nest_in_file_class = YES;

        FOO_DEFAULT = 0;
        FOO_VALUE = 1;
      }

      enum UnnestedEnum {
        BAR_DEFAULT = 0;
        BAR_VALUE = 1;
      }

      message EnumWrapper {
        enum NestedInEnumWrapper {
          BAZ_DEFAULT = 0;
          BAZ_VALUE = 1;
        }
      }
                )schema");

  ClassNameResolver resolver;
  auto file = pool_.FindFileByName("foo.proto");
  auto nest_in_file_enum = file->FindEnumTypeByName("NestedInFileClassEnum");
  auto unnested_enum = file->FindEnumTypeByName("UnnestedEnum");
  auto nested_in_enum_wrapper = file->FindMessageTypeByName("EnumWrapper")
                                    ->FindEnumTypeByName("NestedInEnumWrapper");

  EXPECT_EQ(resolver.GetClassName(unnested_enum,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.UnnestedEnum");
  EXPECT_EQ(resolver.GetClassName(nest_in_file_enum,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooProto.NestedInFileClassEnum");
  EXPECT_EQ(resolver.GetClassName(nested_in_enum_wrapper,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.EnumWrapper.NestedInEnumWrapper");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(unnested_enum),
            PACKAGE_PREFIX "proto2_unittest.UnnestedEnum");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nest_in_file_enum),
            PACKAGE_PREFIX "proto2_unittest.FooProto$NestedInFileClassEnum");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nested_in_enum_wrapper),
            PACKAGE_PREFIX "proto2_unittest.EnumWrapper$NestedInEnumWrapper");
}